

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O2

void pstack::print_container<std::vector<unsigned_char,std::allocator<unsigned_char>>,char_const&>
               (ostream *os,long *container,char *ctx)

{
  uchar *puVar1;
  ostream *os_00;
  char *pcVar2;
  uchar *field;
  uchar *puVar3;
  JSON<unsigned_char,_char> local_40;
  
  std::operator<<(os,"[ ");
  puVar1 = (uchar *)container[1];
  pcVar2 = "";
  for (puVar3 = (uchar *)*container; puVar3 != puVar1; puVar3 = puVar3 + 1) {
    os_00 = std::operator<<(os,pcVar2);
    local_40.object = puVar3;
    local_40.context = ctx;
    operator<<(os_00,&local_40);
    pcVar2 = ",\n";
  }
  std::operator<<(os," ]");
  return;
}

Assistant:

void print_container(std::ostream &os, const Container &container, Context &&ctx, std::false_type)
{
   os << "[ ";
   const char *sep = "";
   for (const auto &field : container) {
      os << sep << json(field, ctx);
      sep = ",\n";
   }
   os << " ]";
}